

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  ChannelOrder CVar4;
  bool bVar5;
  undefined4 uVar6;
  long *plVar7;
  char *__s;
  undefined8 *puVar8;
  ulong uVar9;
  TestLog *pTVar10;
  size_type *psVar11;
  ConstPixelBufferAccess *__n;
  int iVar12;
  void *__buf;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  int z;
  int iVar13;
  int *piVar14;
  int iVar15;
  int i;
  long lVar16;
  int y;
  int iVar17;
  int iVar18;
  IVec3 invocationGlobalIDs [5];
  int assignArgs [5];
  bool local_597;
  allocator<char> local_595;
  int local_594;
  string local_590;
  string local_570;
  int local_54c;
  TestLog *local_548;
  ConstPixelBufferAccess *local_540;
  EndResultVerifier *local_538;
  long *local_530 [2];
  long local_520 [2];
  Vector<int,_2> local_510;
  long *local_508;
  int aiStack_500 [2];
  long local_4f8 [3];
  undefined4 uStack_4e0;
  undefined4 local_4dc;
  undefined4 uStack_4d8;
  undefined8 uStack_4d4;
  Functional local_4c8 [24];
  undefined1 local_4b0 [120];
  ios_base local_438 [264];
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_548 = log;
  local_538 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::ostream::operator<<((ostringstream *)local_4b0,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x70));
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_508,0,(char *)0x0,0x9838ae);
  pTVar10 = (TestLog *)(plVar7 + 2);
  if ((TestLog *)*plVar7 == pTVar10) {
    local_320[0]._0_8_ = pTVar10->m_log;
    local_320[0]._8_8_ = plVar7[3];
    local_330._0_8_ = (TestLog *)(local_330 + 0x10);
  }
  else {
    local_320[0]._0_8_ = pTVar10->m_log;
    local_330._0_8_ = (TestLog *)*plVar7;
  }
  local_330._8_8_ = plVar7[1];
  *plVar7 = (long)pTVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_538->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_0098281c)
                     [(int)(&(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)
                           [sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_530,__s,&local_595);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_530,0,(char *)0x0,0x9f086a);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::ostream::operator<<(local_4b0,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x70));
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_530,0,(char *)0x0,0x9833c5);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  psVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_590.field_2._M_allocated_capacity = *psVar11;
    local_590.field_2._8_8_ = puVar8[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *psVar11;
    local_590._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_590._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_590,0,(char *)0x0,0x9838b9);
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_570.field_2._M_allocated_capacity = *psVar11;
    local_570.field_2._8_8_ = plVar7[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *psVar11;
    local_570._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_570._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __n = resultSlice;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_330,&local_570,resultSlice,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)local_548,__buf,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if (local_530[0] != local_520) {
    operator_delete(local_530[0],local_520[0] + 1);
  }
  if ((TestLog *)local_330._0_8_ != (TestLog *)(local_330 + 0x10)) {
    operator_delete((void *)local_330._0_8_,(ulong)(local_320[0]._M_allocated_capacity + 1));
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508,local_4f8[0] + 1);
  }
  iVar17 = (resultSlice->m_size).m_data[1];
  local_597 = iVar17 < 1;
  if (0 < iVar17) {
    local_54c = sliceOrFaceNdx * sliceOrFaceNdx;
    iVar17 = 0;
    local_540 = resultSlice;
    do {
      iVar13 = (resultSlice->m_size).m_data[0];
      bVar5 = 0 < iVar13;
      if (0 < iVar13) {
        iVar18 = iVar17 * iVar17 + local_54c;
        iVar13 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_4b0,(int)resultSlice,iVar13,iVar17);
          uVar6 = local_4b0._0_4_;
          uStack_4d8 = 0;
          uStack_4d4 = 0;
          local_4f8[2] = 0;
          uStack_4e0 = 0;
          local_4dc = 0;
          local_4f8[0] = 0;
          local_4f8[1] = 0;
          local_508 = (long *)0x0;
          aiStack_500[0] = 0;
          aiStack_500[1] = 0;
          iVar2 = (resultSlice->m_size).m_data[0];
          iVar3 = local_538->m_imageWidth;
          piVar14 = aiStack_500;
          lVar16 = 0;
          iVar15 = iVar13;
          do {
            piVar14[-2] = iVar15;
            piVar14[-1] = iVar17;
            *piVar14 = sliceOrFaceNdx;
            iVar12 = (iVar3 + iVar15) % iVar3;
            *(int *)(local_4c8 + lVar16 * 4) =
                 ((iVar3 + iVar15) / iVar3) * 0x2a + iVar12 * iVar12 + iVar18;
            lVar16 = lVar16 + 1;
            iVar15 = iVar15 + iVar2;
            piVar14 = piVar14 + 3;
          } while (lVar16 != 5);
          uVar9 = 0;
          do {
            CVar4 = *(ChannelOrder *)(local_4c8 + uVar9 * 4);
            if (3 < uVar9) break;
            uVar9 = uVar9 + 1;
          } while (uVar6 != CVar4);
          poVar1 = (ostringstream *)(local_330 + 8);
          local_594 = iVar13;
          if (uVar6 != CVar4) {
            local_330._0_8_ = local_548;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// Failure: invalid value at pixel ",0x23);
            local_510.m_data[0] = local_594;
            local_510.m_data[1] = iVar17;
            tcu::operator<<((ostream *)poVar1,&local_510);
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_330 + 8),": got ",6);
            std::ostream::operator<<(local_330 + 8,uVar6);
            local_1b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// Note: relevant shader invocation global IDs are ",0x33)
            ;
            arrayStr<tcu::Vector<int,3>,5>(&local_570,(Functional *)&local_508,arr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_570._M_dataplus._M_p,local_570._M_string_length);
            local_4b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_4b0 + 8),"// Note: expected one of ",0x19);
            arrayStr<int,5>(&local_590,local_4c8,arr_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_4b0 + 8),local_590._M_dataplus._M_p,
                       local_590._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_4b0 + 8),
                       " (those are the values given as the \'data\' argument in the invocations that contribute to this pixel)"
                       ,0x65);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_590._M_dataplus._M_p != &local_590.field_2) {
              operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4b0 + 8));
            std::ios_base::~ios_base(local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570._M_dataplus._M_p != &local_570.field_2) {
              operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_330 + 8));
            std::ios_base::~ios_base(local_2b8);
            if (uVar6 != CVar4) {
              resultSlice = local_540;
              if (bVar5) {
                return local_597;
              }
              break;
            }
          }
          iVar13 = local_594 + 1;
          iVar2 = (local_540->m_size).m_data[0];
          bVar5 = iVar13 < iVar2;
          resultSlice = local_540;
        } while (iVar13 < iVar2);
      }
      iVar17 = iVar17 + 1;
      iVar13 = (resultSlice->m_size).m_data[1];
      local_597 = iVar13 <= iVar17;
    } while (iVar17 < iVar13);
  }
  return local_597;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == m_imageWidth);

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			// Compute the value-to-assign arguments that were given to the atomic function in the invocations that contribute to this pixel.
			// One of those should be the result.

			const int	result = resultSlice.getPixelInt(x, y).x();
			IVec3		invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int			assignArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				assignArgs[i]			= getAssignArg(gid, m_imageWidth);
			}

			{
				bool matchFound = false;
				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = result == assignArgs[i];

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << result << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected one of " << arrayStr(assignArgs)
											<< " (those are the values given as the 'data' argument in the invocations that contribute to this pixel)"
											<< TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}